

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O2

llama_model_params * llama_model_default_params(void)

{
  llama_model_params *in_RDI;
  
  in_RDI->n_gpu_layers = 0;
  in_RDI->split_mode = LLAMA_SPLIT_MODE_NONE;
  *(undefined8 *)&in_RDI->main_gpu = 0;
  in_RDI->progress_callback_user_data = (void *)0x0;
  in_RDI->kv_overrides = (llama_model_kv_override *)0x0;
  in_RDI->tensor_split = (float *)0x0;
  in_RDI->progress_callback = (llama_progress_callback)0x0;
  in_RDI->vocab_only = false;
  in_RDI->use_mmap = false;
  in_RDI->use_mlock = false;
  in_RDI->check_tensors = false;
  *(undefined4 *)&in_RDI->field_0x44 = 0;
  in_RDI->devices = (ggml_backend_dev_t *)0x0;
  in_RDI->tensor_buft_overrides = (llama_model_tensor_buft_override *)0x0;
  in_RDI->split_mode = LLAMA_SPLIT_MODE_LAYER;
  in_RDI->use_mmap = true;
  return in_RDI;
}

Assistant:

llama_model_params llama_model_default_params() {
    llama_model_params result = {
        /*.devices                     =*/ nullptr,
        /*.tensor_buft_overrides       =*/ nullptr,
        /*.n_gpu_layers                =*/ 0,
        /*.split_mode                  =*/ LLAMA_SPLIT_MODE_LAYER,
        /*.main_gpu                    =*/ 0,
        /*.tensor_split                =*/ nullptr,
        /*.progress_callback           =*/ nullptr,
        /*.progress_callback_user_data =*/ nullptr,
        /*.kv_overrides                =*/ nullptr,
        /*.vocab_only                  =*/ false,
        /*.use_mmap                    =*/ true,
        /*.use_mlock                   =*/ false,
        /*.check_tensors               =*/ false,
    };

#ifdef GGML_USE_METAL
    // note: we usually have plenty of VRAM, so by default offload all layers to the GPU
    result.n_gpu_layers = 999;
#endif

    return result;
}